

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O3

void Map_MappingTruths(Map_Man_t *pMan)

{
  int nItemsTotal;
  Map_Node_t *p;
  int iVar1;
  ProgressBar *p_00;
  Map_Super_t *pMVar2;
  long lVar3;
  Map_Cut_t *pMVar4;
  uchar uPhases [16];
  uint uCanon [2];
  ulong local_50;
  byte local_48 [16];
  uint local_38 [2];
  
  nItemsTotal = pMan->vMapObjs->nSize;
  p_00 = Extra_ProgressBarStart(_stdout,nItemsTotal);
  if (0 < (long)nItemsTotal) {
    lVar3 = 0;
    do {
      p = pMan->vMapObjs->pArray[lVar3];
      iVar1 = Map_NodeIsAnd(p);
      if (iVar1 != 0) {
        pMVar4 = p->pCuts;
        if (pMVar4 == (Map_Cut_t *)0x0) {
          __assert_fail("pNode->pCuts",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                        ,0x3d,"void Map_MappingTruths(Map_Man_t *)");
        }
        if (pMVar4->nLeaves != '\x01') {
          __assert_fail("pNode->pCuts->nLeaves == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                        ,0x3e,"void Map_MappingTruths(Map_Man_t *)");
        }
        pMVar4->M[0].uPhase = 0;
        pMVar2 = pMan->pSuperLib->pSuperInv;
        pMVar4->M[0].pSupers = pMVar2;
        pMVar4->M[0].uPhaseBest = 0;
        pMVar4->M[0].pSuperBest = pMVar2;
        pMVar4->M[1].uPhase = 0;
        pMVar4->M[1].uPhaseBest = 1;
        pMVar4->M[1].pSupers = pMVar2;
        pMVar4->M[1].pSuperBest = pMVar2;
        for (pMVar4 = pMVar4->pNext; pMVar4 != (Map_Cut_t *)0x0; pMVar4 = pMVar4->pNext) {
          if (pMVar4->nLeaves != '\x01') {
            Map_TruthsCutOne(pMan,pMVar4,(uint *)&local_50);
            Map_CanonComputeFast
                      (pMan,pMan->nVarsMax,(int)pMVar4->nLeaves,(uint *)&local_50,local_48,local_38)
            ;
            pMVar2 = Map_SuperTableLookupC(pMan->pSuperLib,local_38);
            pMVar4->M[1].pSupers = pMVar2;
            pMVar4->M[1].uPhase = (uint)local_48[0];
            pMan->nCanons = pMan->nCanons + 1;
            local_50 = ~local_50;
            Map_CanonComputeFast
                      (pMan,pMan->nVarsMax,(int)pMVar4->nLeaves,(uint *)&local_50,local_48,local_38)
            ;
            pMVar2 = Map_SuperTableLookupC(pMan->pSuperLib,local_38);
            pMVar4->M[0].pSupers = pMVar2;
            pMVar4->M[0].uPhase = (uint)local_48[0];
            pMan->nCanons = pMan->nCanons + 1;
          }
        }
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar3)) {
          Extra_ProgressBarUpdate_int(p_00,(int)lVar3,"Tables ...");
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != nItemsTotal);
  }
  Extra_ProgressBarStop(p_00);
  return;
}

Assistant:

void Map_MappingTruths( Map_Man_t * pMan )
{
    ProgressBar * pProgress;
    Map_Node_t * pNode;
    Map_Cut_t * pCut;
    int nNodes, i;
    // compute the cuts for the POs
    nNodes = pMan->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( !Map_NodeIsAnd( pNode ) )
            continue;
        assert( pNode->pCuts );
        assert( pNode->pCuts->nLeaves == 1 );

        // match the simple cut
        pNode->pCuts->M[0].uPhase     = 0;
        pNode->pCuts->M[0].pSupers    = pMan->pSuperLib->pSuperInv;
        pNode->pCuts->M[0].uPhaseBest = 0;
        pNode->pCuts->M[0].pSuperBest = pMan->pSuperLib->pSuperInv;

        pNode->pCuts->M[1].uPhase     = 0;
        pNode->pCuts->M[1].pSupers    = pMan->pSuperLib->pSuperInv;
        pNode->pCuts->M[1].uPhaseBest = 1;
        pNode->pCuts->M[1].pSuperBest = pMan->pSuperLib->pSuperInv;

        // match the rest of the cuts
        for ( pCut = pNode->pCuts->pNext; pCut; pCut = pCut->pNext )
             Map_TruthsCut( pMan, pCut );
        Extra_ProgressBarUpdate( pProgress, i, "Tables ..." );
    }
    Extra_ProgressBarStop( pProgress );
}